

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O0

size_t fs_user_config_dir(char *path,size_t buffer_size)

{
  size_type sVar1;
  string local_48 [32];
  __sv_type local_28;
  size_t local_18;
  size_t buffer_size_local;
  char *path_local;
  
  local_18 = buffer_size;
  buffer_size_local = (size_t)path;
  fs_user_config_dir_abi_cxx11_();
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
  sVar1 = fs_str2char(local_28,(char *)buffer_size_local,local_18);
  std::__cxx11::string::~string(local_48);
  return sVar1;
}

Assistant:

size_t fs_user_config_dir(char* path, const size_t buffer_size)
{
  return fs_str2char(fs_user_config_dir(), path, buffer_size);
}